

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdiriterator.cpp
# Opt level: O0

void __thiscall QDirIteratorPrivate::advance(QDirIteratorPrivate *this)

{
  long lVar1;
  bool bVar2;
  QFileInfo *this_00;
  QDirListing *in_RDI;
  long in_FS_OFFSET;
  QFileInfo *in_stack_ffffffffffffffb8;
  QFileInfo *in_stack_ffffffffffffffc0;
  QDirListing *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI + 1;
  QDirListing::end(in_RDI);
  bVar2 = ::operator==(this_01);
  if (bVar2) {
    QFileInfo::QFileInfo((QFileInfo *)this_01);
    QFileInfo::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    QFileInfo::~QFileInfo((QFileInfo *)0x2a1fad);
  }
  else {
    QFileInfo::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    this_00 = (QFileInfo *)
              QDirListing::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffffb8);
    QDirListing::end(in_RDI);
    bVar2 = ::operator!=(this_00);
    if (bVar2) {
      QDirListing::const_iterator::operator->((const_iterator *)(in_RDI + 1));
      QDirListing::DirEntry::fileInfo((DirEntry *)in_RDI);
      QFileInfo::operator=(this_00,in_stack_ffffffffffffffb8);
      QFileInfo::~QFileInfo((QFileInfo *)0x2a2029);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void advance()
    {
        // Match the behavior of advance() from before porting to QDirListing,
        // that is, even if hasNext() returns false, calling next() returns an
        // empty string without crashing. QTBUG-130142
        if (it == lister.end()) {
            currentFileInfo = {};
            return;
        }
        currentFileInfo = nextFileInfo;
        if (++it != lister.end()) {
            nextFileInfo = it->fileInfo();
        }
    }